

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

string * __thiscall Parser::getTokenName_abi_cxx11_(Parser *this,int num)

{
  const_reference pvVar1;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(in_RSI + 0x10),(long)in_EDX);
  std::__cxx11::string::string(in_RDI,(string *)pvVar1);
  return in_RDI;
}

Assistant:

std::string Parser::getTokenName(int num) const
{
	return tokenNames[num];
}